

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdown-tokens.cpp
# Opt level: O2

void __thiscall markdown::token::Container::writeAsHtml(Container *this,ostream *out)

{
  type pTVar1;
  _List_node_base *p_Var2;
  
  (*(this->super_Token)._vptr_Token[0x10])();
  p_Var2 = (_List_node_base *)&this->mSubTokens;
  while (p_Var2 = (((_List_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                     *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)&this->mSubTokens) {
    pTVar1 = boost::shared_ptr<markdown::Token>::operator->
                       ((shared_ptr<markdown::Token> *)(p_Var2 + 1));
    (*pTVar1->_vptr_Token[2])(pTVar1,out);
  }
  (*(this->super_Token)._vptr_Token[0x11])(this,out);
  return;
}

Assistant:

void Container::writeAsHtml(std::ostream& out) const {
	preWrite(out);
	for (CTokenGroupIter i=mSubTokens.begin(), ie=mSubTokens.end(); i!=ie; ++i)
		(*i)->writeAsHtml(out);
	postWrite(out);
}